

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O0

bool __thiscall
dg::vr::RelationsAnalyzer::processICMP
          (RelationsAnalyzer *this,ValueRelations *oldGraph,ValueRelations *newGraph,
          VRAssumeBool *assume)

{
  bool bVar1;
  Relation RVar2;
  ValueRelations *this_00;
  Value *icmp_00;
  VRAssumeBool *in_RCX;
  undefined8 in_RDI;
  Relation rel;
  V op2;
  V op1;
  bool assumption;
  ICmpInst *icmp;
  Value *in_stack_000000a0;
  Value *in_stack_000000a8;
  ValueRelations *in_stack_000000b0;
  RelationsAnalyzer *in_stack_000000b8;
  Type rel_00;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  bool local_1;
  
  rel_00 = (Type)((ulong)in_RDI >> 0x20);
  VRAssume::getValue(&in_RCX->super_VRAssume);
  llvm::cast<llvm::ICmpInst,llvm::Value_const>((Value *)0x1cfad3);
  VRAssumeBool::getAssumption(in_RCX);
  this_00 = (ValueRelations *)
            llvm::CmpInst::getOperand
                      ((CmpInst *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       rel_00);
  icmp_00 = llvm::CmpInst::getOperand
                      ((CmpInst *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       rel_00);
  RVar2 = ICMPToRel((ICmpInst *)icmp_00,SUB41((uint)in_stack_ffffffffffffffb4 >> 0x18,0));
  bVar1 = ValueRelations::hasConflictingRelation<llvm::Value_const*,llvm::Value_const*>
                    (this_00,(Value **)icmp_00,(Value **)CONCAT44(RVar2,in_stack_ffffffffffffffb0),
                     rel_00);
  if (bVar1) {
    local_1 = false;
  }
  else {
    ValueRelations::set<llvm::Value_const*,llvm::Value_const*>
              (oldGraph,(Value **)newGraph,assume._4_4_,(Value **)icmp);
    if ((RVar2 == EQ) &&
       (bVar1 = findEqualBorderBucket
                          (in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,in_stack_000000a0),
       !bVar1)) {
      findEqualBorderBucket(in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,in_stack_000000a0)
      ;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool RelationsAnalyzer::processICMP(const ValueRelations &oldGraph,
                                    ValueRelations &newGraph,
                                    VRAssumeBool *assume) {
    const llvm::ICmpInst *icmp = llvm::cast<llvm::ICmpInst>(assume->getValue());
    bool assumption = assume->getAssumption();

    V op1 = icmp->getOperand(0);
    V op2 = icmp->getOperand(1);

    Relation rel = ICMPToRel(icmp, assumption);

    if (oldGraph.hasConflictingRelation(op1, op2, rel))
        return false;

    newGraph.set(op1, rel, op2);

    if (rel == Relations::EQ) {
        if (!findEqualBorderBucket(oldGraph, op1, op2))
            findEqualBorderBucket(oldGraph, op2, op1);
    }
    return true;
}